

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer plVar4;
  layer_creator_func p_Var5;
  pointer pBVar6;
  iterator __position;
  int *piVar7;
  void *pvVar8;
  Allocator *pAVar9;
  pointer pMVar10;
  long *plVar11;
  int iVar12;
  int iVar13;
  Net *pNVar14;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *pvVar15;
  DataReader *pDVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar18;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar19;
  long lVar20;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  long lVar21;
  int *piVar22;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  int bottom_blob_index;
  ParamDict pd;
  int local_a08;
  int local_a04;
  int local_a00;
  uint local_9fc;
  Mat local_9f8;
  int local_9b8;
  int local_9b4;
  Layer *local_9b0;
  Net *local_9a8;
  vector<int,_std::allocator<int>_> *local_9a0;
  int local_994;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_990;
  vector<int,_std::allocator<int>_> *local_988;
  DataReader *local_980;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_978;
  Mat local_970;
  ParamDict local_930;
  
  local_994 = 0;
  local_9a8 = this;
  iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_994,4);
  if (CONCAT44(extraout_var,iVar17) == 4) {
    if (local_994 == 0x7685dd) {
      local_9b4 = 0;
      local_9b8 = 0;
      iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_9b4,4);
      if (CONCAT44(extraout_var_00,iVar17) == 4) {
        iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_9b8,4);
        pNVar14 = local_9a8;
        if (CONCAT44(extraout_var_01,iVar17) == 4) {
          if ((0 < (long)local_9b4) && (0 < local_9b8)) {
            local_978 = &local_9a8->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_978,(long)local_9b4);
            this_00 = &pNVar14->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)local_9b8);
            ParamDict::ParamDict(&local_930);
            local_a00 = 0;
            pvVar15 = this_00;
            pDVar16 = dr;
            if (0 < local_9b4) {
              do {
                local_980 = pDVar16;
                local_990 = pvVar15;
                iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_9fc,4);
                if (CONCAT44(extraout_var_02,iVar17) != 4) {
                  load_param_bin();
LAB_0012d580:
                  iVar17 = -1;
                  goto LAB_0012d585;
                }
                iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_a04,4);
                if (CONCAT44(extraout_var_03,iVar17) != 4) {
                  load_param_bin();
                  goto LAB_0012d580;
                }
                iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_a08,4);
                if (CONCAT44(extraout_var_04,iVar17) != 4) {
                  load_param_bin();
                  goto LAB_0012d580;
                }
                pLVar18 = create_layer(local_9fc);
                if (pLVar18 == (Layer *)0x0) {
                  uVar19 = (ulong)local_9fc;
                  if (-1 < (int)local_9fc) {
                    plVar4 = (local_9a8->custom_layer_registry).
                             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (((ulong)(local_9fc & 0xfffffeff) <
                         (ulong)((long)(local_9a8->custom_layer_registry).
                                       super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >>
                                4)) &&
                       (p_Var5 = plVar4[local_9fc & 0xfffffeff].creator,
                       p_Var5 != (layer_creator_func)0x0)) {
                      pLVar18 = (*p_Var5)();
                      if (pLVar18 != (Layer *)0x0) goto LAB_0012cd28;
                      uVar19 = (ulong)local_9fc;
                    }
                  }
                  fprintf(_stderr,"layer %d not exists or registered",uVar19);
                  fputc(10,_stderr);
                  clear(local_9a8);
                  goto LAB_0012d580;
                }
LAB_0012cd28:
                local_988 = &pLVar18->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_988,(long)local_a04);
                local_9b0 = pLVar18;
                if (0 < local_a04) {
                  lVar20 = 0;
                  do {
                    iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_970,4);
                    if (CONCAT44(extraout_var_05,iVar17) != 4) {
                      load_param_bin();
                      goto LAB_0012d580;
                    }
                    pBVar6 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    __position._M_current =
                         pBVar6[(int)local_970.data].consumers.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        pBVar6[(int)local_970.data].consumers.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)
                                 &pBVar6[(int)local_970.data].consumers,__position,&local_a00);
                    }
                    else {
                      *__position._M_current = local_a00;
                      pBVar6[(int)local_970.data].consumers.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish = __position._M_current + 1;
                    }
                    (local_988->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20] = (int)local_970.data;
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < local_a04);
                }
                local_9a0 = &local_9b0->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_9a0,(long)local_a08);
                if (0 < local_a08) {
                  lVar20 = 0;
                  do {
                    iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_970,4);
                    if (CONCAT44(extraout_var_06,iVar17) != 4) {
                      load_param_bin();
                      goto LAB_0012d580;
                    }
                    (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)local_970.data].producer = local_a00;
                    (local_9a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20] = (int)local_970.data;
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < local_a08);
                }
                iVar17 = ParamDict::load_param_bin(&local_930,dr);
                if (iVar17 == 0) {
                  local_9f8.elemsize._0_4_ = 0;
                  local_9f8.elemsize._4_4_ = 0;
                  local_9f8.elempack = 0;
                  local_9f8.data = (void *)0x0;
                  local_9f8.refcount._0_4_ = 0;
                  local_9f8.refcount._4_4_ = 0;
                  local_9f8.h = 0;
                  local_9f8.c = 0;
                  local_9f8.cstep = 0;
                  local_9f8.allocator = (Allocator *)0x0;
                  local_9f8.dims = 0;
                  local_9f8.w = 0;
                  ParamDict::get(&local_970,&local_930,0x1e,&local_9f8);
                  piVar22 = (int *)CONCAT44(local_9f8.refcount._4_4_,local_9f8.refcount._0_4_);
                  if (piVar22 != (int *)0x0) {
                    LOCK();
                    *piVar22 = *piVar22 + -1;
                    UNLOCK();
                    if (*piVar22 == 0) {
                      if (local_9f8.allocator == (Allocator *)0x0) {
                        if (local_9f8.data != (void *)0x0) {
                          free(local_9f8.data);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_9f8.allocator + 0x18))();
                      }
                    }
                  }
                  if (((CONCAT44(local_970.data._4_4_,(int)local_970.data) != 0) &&
                      ((long)local_970.c * local_970.cstep != 0)) && (0 < local_a08)) {
                    piVar22 = (int *)(CONCAT44(local_970.data._4_4_,(int)local_970.data) + 8);
                    lVar20 = 0;
                    do {
                      iVar17 = (local_9a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar20];
                      pBVar6 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      iVar3 = piVar22[-2];
                      if (iVar3 == 3) {
                        local_9f8.h = piVar22[0];
                        local_9f8.c = piVar22[1];
                        local_9f8.data = (void *)0x0;
                        local_9f8.refcount._0_4_ = 0;
                        local_9f8.refcount._4_4_ = 0;
                        local_9f8.elemsize._0_4_ = 4;
                        local_9f8.elemsize._4_4_ = 0;
                        local_9f8.elempack = 1;
                        local_9f8.allocator = (Allocator *)0x0;
                        local_9f8.w = piVar22[-1];
                        local_9f8.dims = 3;
                        local_9f8.cstep =
                             (long)(local_9f8.h * piVar22[-1]) + 3U & 0x3ffffffffffffffc;
                        if (&pBVar6[iVar17].shape != &local_9f8) {
                          piVar7 = pBVar6[iVar17].shape.refcount;
                          if (piVar7 != (int *)0x0) {
                            LOCK();
                            *piVar7 = *piVar7 + -1;
                            UNLOCK();
                            if (*piVar7 == 0) {
                              pvVar8 = pBVar6[iVar17].shape.data;
                              pAVar9 = pBVar6[iVar17].shape.allocator;
                              if (pAVar9 == (Allocator *)0x0) {
                                if (pvVar8 != (void *)0x0) {
                                  free(pvVar8);
                                }
                              }
                              else {
                                (**(code **)(*(long *)pAVar9 + 0x18))();
                              }
                            }
                          }
                          *(undefined8 *)((long)&pBVar6[iVar17].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar6[iVar17].shape.elemsize + 4) = 0;
                          pBVar6[iVar17].shape.data = (void *)0x0;
                          pBVar6[iVar17].shape.refcount = (int *)0x0;
                          pBVar6[iVar17].shape.dims = 0;
                          pBVar6[iVar17].shape.w = 0;
                          pBVar6[iVar17].shape.h = 0;
                          pBVar6[iVar17].shape.c = 0;
                          pBVar6[iVar17].shape.cstep = 0;
                          pBVar6[iVar17].shape.data = local_9f8.data;
                          piVar7 = (int *)CONCAT44(local_9f8.refcount._4_4_,local_9f8.refcount._0_4_
                                                  );
                          pBVar6[iVar17].shape.refcount = piVar7;
                          pBVar6[iVar17].shape.elemsize =
                               CONCAT44(local_9f8.elemsize._4_4_,(undefined4)local_9f8.elemsize);
                          pBVar6[iVar17].shape.elempack = local_9f8.elempack;
                          pBVar6[iVar17].shape.allocator = local_9f8.allocator;
                          pBVar6[iVar17].shape.dims = local_9f8.dims;
                          pBVar6[iVar17].shape.w = local_9f8.w;
                          pBVar6[iVar17].shape.h = local_9f8.h;
                          pBVar6[iVar17].shape.c = local_9f8.c;
                          pBVar6[iVar17].shape.cstep = local_9f8.cstep;
                          if (piVar7 != (int *)0x0) {
                            LOCK();
                            *piVar7 = *piVar7 + -1;
                            UNLOCK();
                            if (*piVar7 == 0) {
                              if (local_9f8.allocator == (Allocator *)0x0) {
LAB_0012d26d:
                                if (local_9f8.data != (void *)0x0) {
                                  free(local_9f8.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_9f8.allocator + 0x18))();
                              }
                            }
                          }
                        }
                      }
                      else if (iVar3 == 2) {
                        local_9f8.data = (void *)0x0;
                        local_9f8.refcount._0_4_ = 0;
                        local_9f8.refcount._4_4_ = 0;
                        local_9f8.elemsize._0_4_ = 4;
                        local_9f8.elemsize._4_4_ = 0;
                        local_9f8.elempack = 1;
                        local_9f8.allocator = (Allocator *)0x0;
                        local_9f8.w = piVar22[-1];
                        local_9f8.dims = 2;
                        local_9f8.c = 1;
                        local_9f8.h = *piVar22;
                        local_9f8.cstep = (size_t)(*piVar22 * piVar22[-1]);
                        if (&pBVar6[iVar17].shape != &local_9f8) {
                          piVar7 = pBVar6[iVar17].shape.refcount;
                          if (piVar7 != (int *)0x0) {
                            LOCK();
                            *piVar7 = *piVar7 + -1;
                            UNLOCK();
                            if (*piVar7 == 0) {
                              pvVar8 = pBVar6[iVar17].shape.data;
                              pAVar9 = pBVar6[iVar17].shape.allocator;
                              if (pAVar9 == (Allocator *)0x0) {
                                if (pvVar8 != (void *)0x0) {
                                  free(pvVar8);
                                }
                              }
                              else {
                                (**(code **)(*(long *)pAVar9 + 0x18))();
                              }
                            }
                          }
                          *(undefined8 *)((long)&pBVar6[iVar17].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar6[iVar17].shape.elemsize + 4) = 0;
                          pBVar6[iVar17].shape.data = (void *)0x0;
                          pBVar6[iVar17].shape.refcount = (int *)0x0;
                          pBVar6[iVar17].shape.dims = 0;
                          pBVar6[iVar17].shape.w = 0;
                          pBVar6[iVar17].shape.h = 0;
                          pBVar6[iVar17].shape.c = 0;
                          pBVar6[iVar17].shape.cstep = 0;
                          pBVar6[iVar17].shape.data = local_9f8.data;
                          piVar7 = (int *)CONCAT44(local_9f8.refcount._4_4_,local_9f8.refcount._0_4_
                                                  );
                          pBVar6[iVar17].shape.refcount = piVar7;
                          pBVar6[iVar17].shape.elemsize =
                               CONCAT44(local_9f8.elemsize._4_4_,(undefined4)local_9f8.elemsize);
                          pBVar6[iVar17].shape.elempack = local_9f8.elempack;
                          pBVar6[iVar17].shape.allocator = local_9f8.allocator;
                          pBVar6[iVar17].shape.dims = local_9f8.dims;
                          pBVar6[iVar17].shape.w = local_9f8.w;
                          pBVar6[iVar17].shape.h = local_9f8.h;
                          pBVar6[iVar17].shape.c = local_9f8.c;
                          pBVar6[iVar17].shape.cstep = local_9f8.cstep;
                          if (piVar7 != (int *)0x0) {
                            LOCK();
                            *piVar7 = *piVar7 + -1;
                            UNLOCK();
                            if (*piVar7 == 0) {
                              if (local_9f8.allocator == (Allocator *)0x0) goto LAB_0012d26d;
                              (**(code **)(*(long *)local_9f8.allocator + 0x18))();
                            }
                          }
                        }
                      }
                      else if (iVar3 == 1) {
                        local_9f8.cstep = (size_t)piVar22[-1];
                        local_9f8.data = (void *)0x0;
                        local_9f8.refcount._0_4_ = 0;
                        local_9f8.refcount._4_4_ = 0;
                        local_9f8.elemsize._0_4_ = 4;
                        local_9f8.elemsize._4_4_ = 0;
                        local_9f8.elempack = 1;
                        local_9f8.allocator = (Allocator *)0x0;
                        local_9f8.w = piVar22[-1];
                        local_9f8.dims = 1;
                        local_9f8.h = 1;
                        local_9f8.c = 1;
                        if (&pBVar6[iVar17].shape != &local_9f8) {
                          piVar7 = pBVar6[iVar17].shape.refcount;
                          if (piVar7 != (int *)0x0) {
                            LOCK();
                            *piVar7 = *piVar7 + -1;
                            UNLOCK();
                            if (*piVar7 == 0) {
                              pvVar8 = pBVar6[iVar17].shape.data;
                              pAVar9 = pBVar6[iVar17].shape.allocator;
                              if (pAVar9 == (Allocator *)0x0) {
                                if (pvVar8 != (void *)0x0) {
                                  free(pvVar8);
                                }
                              }
                              else {
                                (**(code **)(*(long *)pAVar9 + 0x18))();
                              }
                            }
                          }
                          *(undefined8 *)((long)&pBVar6[iVar17].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar6[iVar17].shape.elemsize + 4) = 0;
                          pBVar6[iVar17].shape.data = (void *)0x0;
                          pBVar6[iVar17].shape.refcount = (int *)0x0;
                          pBVar6[iVar17].shape.dims = 0;
                          pBVar6[iVar17].shape.w = 0;
                          pBVar6[iVar17].shape.h = 0;
                          pBVar6[iVar17].shape.c = 0;
                          pBVar6[iVar17].shape.cstep = 0;
                          pBVar6[iVar17].shape.data = local_9f8.data;
                          piVar7 = (int *)CONCAT44(local_9f8.refcount._4_4_,local_9f8.refcount._0_4_
                                                  );
                          pBVar6[iVar17].shape.refcount = piVar7;
                          pBVar6[iVar17].shape.elemsize =
                               CONCAT44(local_9f8.elemsize._4_4_,(undefined4)local_9f8.elemsize);
                          pBVar6[iVar17].shape.elempack = local_9f8.elempack;
                          pBVar6[iVar17].shape.allocator = local_9f8.allocator;
                          pBVar6[iVar17].shape.dims = local_9f8.dims;
                          pBVar6[iVar17].shape.w = local_9f8.w;
                          pBVar6[iVar17].shape.h = local_9f8.h;
                          pBVar6[iVar17].shape.c = local_9f8.c;
                          pBVar6[iVar17].shape.cstep = local_9f8.cstep;
                          if (piVar7 != (int *)0x0) {
                            LOCK();
                            *piVar7 = *piVar7 + -1;
                            UNLOCK();
                            if (*piVar7 == 0) {
                              if (local_9f8.allocator == (Allocator *)0x0) goto LAB_0012d26d;
                              (**(code **)(*(long *)local_9f8.allocator + 0x18))();
                            }
                          }
                        }
                      }
                      lVar20 = lVar20 + 1;
                      piVar22 = piVar22 + 4;
                    } while (lVar20 < local_a08);
                  }
                  pvVar1 = &local_9b0->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_a04)
                  ;
                  if (0 < local_a04) {
                    lVar20 = 0;
                    lVar21 = 0;
                    iVar17 = local_a04;
                    do {
                      iVar3 = (local_988->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar21];
                      pBVar6 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      pMVar10 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar10->data + lVar20);
                      if ((Mat *)puVar2 != &pBVar6[iVar3].shape) {
                        piVar22 = pBVar6[iVar3].shape.refcount;
                        if (piVar22 != (int *)0x0) {
                          LOCK();
                          *piVar22 = *piVar22 + 1;
                          UNLOCK();
                        }
                        piVar22 = *(int **)((long)&pMVar10->refcount + lVar20);
                        if (piVar22 != (int *)0x0) {
                          LOCK();
                          *piVar22 = *piVar22 + -1;
                          UNLOCK();
                          if (*piVar22 == 0) {
                            pvVar8 = *(void **)((long)&pMVar10->data + lVar20);
                            plVar11 = *(long **)((long)&pMVar10->allocator + lVar20);
                            if (plVar11 == (long *)0x0) {
                              if (pvVar8 != (void *)0x0) {
                                free(pvVar8);
                              }
                            }
                            else {
                              (**(code **)(*plVar11 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar20);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined8 *)((long)&pMVar10->cstep + lVar20) = 0;
                        piVar22 = pBVar6[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar10->data + lVar20);
                        *puVar2 = pBVar6[iVar3].shape.data;
                        puVar2[1] = piVar22;
                        *(size_t *)((long)&pMVar10->elemsize + lVar20) =
                             pBVar6[iVar3].shape.elemsize;
                        *(int *)((long)&pMVar10->elempack + lVar20) = pBVar6[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar10->allocator + lVar20) =
                             pBVar6[iVar3].shape.allocator;
                        iVar17 = pBVar6[iVar3].shape.w;
                        iVar12 = pBVar6[iVar3].shape.h;
                        iVar13 = pBVar6[iVar3].shape.c;
                        piVar22 = (int *)((long)&pMVar10->dims + lVar20);
                        *piVar22 = pBVar6[iVar3].shape.dims;
                        piVar22[1] = iVar17;
                        piVar22[2] = iVar12;
                        piVar22[3] = iVar13;
                        *(size_t *)((long)&pMVar10->cstep + lVar20) = pBVar6[iVar3].shape.cstep;
                        iVar17 = local_a04;
                      }
                      lVar21 = lVar21 + 1;
                      lVar20 = lVar20 + 0x40;
                      this_00 = local_990;
                    } while (lVar21 < iVar17);
                  }
                  pvVar1 = &local_9b0->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_a08)
                  ;
                  if (0 < local_a08) {
                    lVar21 = 0;
                    lVar20 = 0;
                    iVar17 = local_a08;
                    do {
                      iVar3 = (local_9a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar20];
                      pBVar6 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      pMVar10 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar10->data + lVar21);
                      if ((Mat *)puVar2 != &pBVar6[iVar3].shape) {
                        piVar22 = pBVar6[iVar3].shape.refcount;
                        if (piVar22 != (int *)0x0) {
                          LOCK();
                          *piVar22 = *piVar22 + 1;
                          UNLOCK();
                        }
                        piVar22 = *(int **)((long)&pMVar10->refcount + lVar21);
                        if (piVar22 != (int *)0x0) {
                          LOCK();
                          *piVar22 = *piVar22 + -1;
                          UNLOCK();
                          if (*piVar22 == 0) {
                            pvVar8 = *(void **)((long)&pMVar10->data + lVar21);
                            plVar11 = *(long **)((long)&pMVar10->allocator + lVar21);
                            if (plVar11 == (long *)0x0) {
                              if (pvVar8 != (void *)0x0) {
                                free(pvVar8);
                              }
                            }
                            else {
                              (**(code **)(*plVar11 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar21);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined8 *)((long)&pMVar10->cstep + lVar21) = 0;
                        piVar22 = pBVar6[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar10->data + lVar21);
                        *puVar2 = pBVar6[iVar3].shape.data;
                        puVar2[1] = piVar22;
                        *(size_t *)((long)&pMVar10->elemsize + lVar21) =
                             pBVar6[iVar3].shape.elemsize;
                        *(int *)((long)&pMVar10->elempack + lVar21) = pBVar6[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar10->allocator + lVar21) =
                             pBVar6[iVar3].shape.allocator;
                        iVar17 = pBVar6[iVar3].shape.w;
                        iVar12 = pBVar6[iVar3].shape.h;
                        iVar13 = pBVar6[iVar3].shape.c;
                        piVar22 = (int *)((long)&pMVar10->dims + lVar21);
                        *piVar22 = pBVar6[iVar3].shape.dims;
                        piVar22[1] = iVar17;
                        piVar22[2] = iVar12;
                        piVar22[3] = iVar13;
                        *(size_t *)((long)&pMVar10->cstep + lVar21) = pBVar6[iVar3].shape.cstep;
                        iVar17 = local_a08;
                      }
                      lVar20 = lVar20 + 1;
                      lVar21 = lVar21 + 0x40;
                      this_00 = local_990;
                    } while (lVar20 < iVar17);
                  }
                  pLVar18 = local_9b0;
                  iVar17 = (*local_9b0->_vptr_Layer[2])(local_9b0,&local_930);
                  dr = local_980;
                  if (iVar17 == 0) {
                    (local_978->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[local_a00] = pLVar18;
                    iVar17 = 0;
                  }
                  else {
                    load_param_bin();
                    iVar17 = 0xe;
                  }
                  if (local_970.refcount != (int *)0x0) {
                    LOCK();
                    *local_970.refcount = *local_970.refcount + -1;
                    UNLOCK();
                    if (*local_970.refcount == 0) {
                      if (local_970.allocator == (Allocator *)0x0) {
                        if ((void *)CONCAT44(local_970.data._4_4_,(int)local_970.data) !=
                            (void *)0x0) {
                          free((void *)CONCAT44(local_970.data._4_4_,(int)local_970.data));
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_970.allocator + 0x18))();
                      }
                    }
                  }
                  if ((iVar17 != 0xe) && (iVar17 != 0)) goto LAB_0012d580;
                }
                else {
                  load_param_bin();
                }
                local_a00 = local_a00 + 1;
                pvVar15 = local_990;
                pDVar16 = local_980;
              } while (local_a00 < local_9b4);
            }
            iVar17 = 0;
LAB_0012d585:
            lVar20 = 0x8c0;
            do {
              piVar22 = *(int **)((long)&local_930.params[0].v.data + lVar20);
              if (piVar22 != (int *)0x0) {
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 == 0) {
                  pvVar8 = *(void **)((long)&local_930.params[0].type + lVar20);
                  plVar11 = *(long **)((long)&local_930.params[0].v.elempack + lVar20);
                  if (plVar11 == (long *)0x0) {
                    if (pvVar8 != (void *)0x0) {
                      free(pvVar8);
                    }
                  }
                  else {
                    (**(code **)(*plVar11 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar20 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar20 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar20) = 0;
              lVar20 = lVar20 + -0x48;
            } while (lVar20 != -0x40);
            return iVar17;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        NCNN_LOGE("read " #buf " failed"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;

#if __APPLE__
        opt.use_image_storage = false;
#endif
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param failed");
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param failed");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}